

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O1

void ObsGetLastMove(pyhanabi_observation_t *observation,int index,pyhanabi_history_item_t *item)

{
  undefined8 *puVar1;
  void *pvVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  
  if (observation == (pyhanabi_observation_t *)0x0) {
    __assert_fail("observation != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x2e6,
                  "void ObsGetLastMove(pyhanabi_observation_t *, int, pyhanabi_history_item_t *)");
  }
  pvVar2 = observation->observation;
  if (pvVar2 == (void *)0x0) {
    __assert_fail("observation->observation != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x2e7,
                  "void ObsGetLastMove(pyhanabi_observation_t *, int, pyhanabi_history_item_t *)");
  }
  if (item == (pyhanabi_history_item_t *)0x0) {
    __assert_fail("item != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x2e8,
                  "void ObsGetLastMove(pyhanabi_observation_t *, int, pyhanabi_history_item_t *)");
  }
  puVar4 = (undefined8 *)operator_new(0x10);
  if ((ulong)(long)index <
      (ulong)(*(long *)((long)pvVar2 + 0x60) - *(long *)((long)pvVar2 + 0x58) >> 4)) {
    puVar1 = (undefined8 *)(*(long *)((long)pvVar2 + 0x58) + (long)index * 0x10);
    uVar3 = puVar1[1];
    *puVar4 = *puVar1;
    puVar4[1] = uVar3;
    item->item = puVar4;
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void ObsGetLastMove(pyhanabi_observation_t* observation, int index,
                    pyhanabi_history_item_t* item) {
  REQUIRE(observation != nullptr);
  REQUIRE(observation->observation != nullptr);
  REQUIRE(item != nullptr);
  item->item = new hanabi_learning_env::HanabiHistoryItem(
      reinterpret_cast<hanabi_learning_env::HanabiObservation*>(
          observation->observation)
          ->LastMoves()
          .at(index));
}